

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O2

void __thiscall basisu::vector<unsigned_int>::set_all(vector<unsigned_int> *this,uint *o)

{
  uint uVar1;
  uint *puVar2;
  long lVar3;
  
  puVar2 = this->m_p;
  uVar1 = this->m_size;
  for (lVar3 = 0; (ulong)uVar1 << 2 != lVar3; lVar3 = lVar3 + 4) {
    *(uint *)((long)puVar2 + lVar3) = *o;
  }
  return;
}

Assistant:

inline void set_all(const T& o)
      {
         if ((sizeof(T) == 1) && (scalar_type<T>::cFlag))
            memset(m_p, *reinterpret_cast<const uint8_t*>(&o), m_size);
         else
         {
            T* pDst = m_p;
            T* pDst_end = pDst + m_size;
            while (pDst != pDst_end)
               *pDst++ = o;
         }
      }